

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

float __thiscall wasm::Random::getFloat(Random *this)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  undefined8 local_18;
  float local_c;
  
  local_28.i32 = get32(this);
  local_18 = 2;
  local_c = (float)local_28.i32;
  wasm::Literal::~Literal((Literal *)&local_28.func);
  return local_c;
}

Assistant:

float Random::getFloat() { return Literal(get32()).reinterpretf32(); }